

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs.c
# Opt level: O3

int run_test_fs_mkstemp(void)

{
  uint64_t uVar1;
  ssize_t sVar2;
  int iVar3;
  uint uVar4;
  int extraout_EAX;
  int extraout_EAX_00;
  int extraout_EAX_01;
  int extraout_EAX_02;
  __uid_t _Var5;
  int extraout_EAX_03;
  char *pcVar6;
  uv_loop_t *puVar7;
  size_t sVar8;
  uv_fs_t *puVar9;
  undefined8 uVar10;
  uv_loop_t *puVar11;
  void *pvVar12;
  char *pcVar13;
  uv_fs_t *puVar14;
  uv_fs_t *puVar15;
  undefined8 *puVar16;
  uv_fs_t *puVar17;
  undefined8 *puVar18;
  uv_loop_t *puVar19;
  char *pcVar20;
  uv_fs_t *unaff_R14;
  uv_fs_t *puVar21;
  uv_fs_t *puVar22;
  uv_buf_t uVar23;
  char path_template [17];
  uv_fs_t req;
  undefined1 auStack_1168 [88];
  long lStack_1110;
  long lStack_1108;
  code *pcStack_fb0;
  code *pcStack_fa8;
  undefined8 uStack_fa0;
  char acStack_f90 [88];
  char *pcStack_f38;
  uv_loop_t *puStack_dd8;
  uv_fs_t *puStack_dd0;
  code *pcStack_dc8;
  code *pcStack_dc0;
  uv_loop_t *puStack_db8;
  code *pcStack_db0;
  uv_fs_t uStack_da8;
  uv_fs_t *puStack_bf0;
  uv_fs_t *puStack_be8;
  undefined8 uStack_be0;
  uv_fs_t uStack_bd0;
  undefined8 *puStack_a18;
  uv_fs_t *puStack_a10;
  code *pcStack_a08;
  code *pcStack_a00;
  undefined1 auStack_9f0 [88];
  long lStack_998;
  uint uStack_978;
  code *pcStack_838;
  undefined8 uStack_830;
  uv_fs_t uStack_828;
  char *pcStack_670;
  uv_fs_t *puStack_668;
  uv_fs_t uStack_650;
  char *pcStack_498;
  uv_fs_t *puStack_490;
  code *pcStack_488;
  undefined8 uStack_480;
  stat64 sStack_470;
  uv_fs_t uStack_3e0;
  uv_loop_t *puStack_228;
  uv_fs_t *puStack_220;
  uv_loop_t *puStack_210;
  uv_fs_t *puStack_208;
  code *pcStack_200;
  undefined8 local_1f8;
  undefined1 local_1e8 [32];
  void *local_170;
  
  puVar7 = (uv_loop_t *)local_1e8;
  local_1e8[0] = 't';
  local_1e8[1] = 'e';
  local_1e8[2] = 's';
  local_1e8[3] = 't';
  local_1e8[4] = '_';
  local_1e8[5] = 'f';
  local_1e8[6] = 'i';
  local_1e8[7] = 'l';
  local_1e8[8] = 'e';
  local_1e8[9] = '_';
  local_1e8[10] = 'X';
  local_1e8[0xb] = 'X';
  local_1e8[0xc] = 'X';
  local_1e8[0xd] = 'X';
  local_1e8[0xe] = 'X';
  local_1e8[0xf] = 'X';
  local_1e8[0x10] = 0;
  pcStack_200 = (code *)0x154390;
  pcVar6 = (char *)uv_default_loop();
  pcStack_200 = (code *)0x1543b0;
  loop = (uv_loop_t *)pcVar6;
  iVar3 = uv_fs_mkstemp(pcVar6,&mkstemp_req1,puVar7,mkstemp_cb);
  if (iVar3 == 0) {
    pcStack_200 = (code *)0x1543c6;
    pcVar6 = (char *)loop;
    uv_run(loop,0);
    if (mkstemp_cb_count != 1) goto LAB_00154636;
    pcVar6 = (char *)0x0;
    pcStack_200 = (code *)0x1543e8;
    iVar3 = uv_fs_mkstemp(0,&mkstemp_req2,local_1e8,0);
    if (iVar3 < 0) goto LAB_0015463b;
    pcStack_200 = (code *)0x1543fc;
    check_mkstemp_result(&mkstemp_req2);
    pcStack_200 = (code *)0x15440f;
    pcVar6 = mkstemp_req1.path;
    iVar3 = strcmp(mkstemp_req1.path,mkstemp_req2.path);
    if (iVar3 == 0) goto LAB_00154640;
    pcVar6 = (char *)0x0;
    pcStack_200 = (code *)0x15442e;
    iVar3 = uv_fs_mkstemp(0,&mkstemp_req3,"test_file",0);
    if (iVar3 != -0x16) goto LAB_00154645;
    pcStack_200 = (code *)0x154448;
    iov = (uv_buf_t)uv_buf_init(test_buf,0xd);
    local_1f8 = 0;
    pcVar6 = (char *)0x0;
    pcStack_200 = (code *)0x154484;
    iVar3 = uv_fs_write(0,&stack0xfffffffffffffe38,(undefined4)mkstemp_req1.result,&iov,1,
                        0xffffffffffffffff);
    if (iVar3 != 0xd) goto LAB_0015464a;
    if (local_170 != (void *)0xd) goto LAB_0015464f;
    puVar7 = (uv_loop_t *)&stack0xfffffffffffffe38;
    pcStack_200 = (code *)0x1544a9;
    uv_fs_req_cleanup(puVar7);
    pcStack_200 = (code *)0x1544bb;
    uv_fs_close(0,puVar7,(undefined4)mkstemp_req1.result,0);
    pcStack_200 = (code *)0x1544c3;
    uv_fs_req_cleanup(puVar7);
    pcStack_200 = (code *)0x1544d5;
    uv_fs_close(0,puVar7,(undefined4)mkstemp_req2.result,0);
    pcStack_200 = (code *)0x1544dd;
    uv_fs_req_cleanup();
    pcVar6 = (char *)0x0;
    pcStack_200 = (code *)0x1544f6;
    uVar4 = uv_fs_open(0,puVar7,mkstemp_req1.path,0,0,0);
    if ((int)uVar4 < 0) goto LAB_00154654;
    puVar7 = (uv_loop_t *)(ulong)uVar4;
    unaff_R14 = (uv_fs_t *)&stack0xfffffffffffffe38;
    pcStack_200 = (code *)0x15450d;
    uv_fs_req_cleanup(unaff_R14);
    buf[0x10] = '\0';
    buf[0x11] = '\0';
    buf[0x12] = '\0';
    buf[0x13] = '\0';
    buf[0x14] = '\0';
    buf[0x15] = '\0';
    buf[0x16] = '\0';
    buf[0x17] = '\0';
    buf[0x18] = '\0';
    buf[0x19] = '\0';
    buf[0x1a] = '\0';
    buf[0x1b] = '\0';
    buf[0x1c] = '\0';
    buf[0x1d] = '\0';
    buf[0x1e] = '\0';
    buf[0x1f] = '\0';
    buf[0] = '\0';
    buf[1] = '\0';
    buf[2] = '\0';
    buf[3] = '\0';
    buf[4] = '\0';
    buf[5] = '\0';
    buf[6] = '\0';
    buf[7] = '\0';
    buf[8] = '\0';
    buf[9] = '\0';
    buf[10] = '\0';
    buf[0xb] = '\0';
    buf[0xc] = '\0';
    buf[0xd] = '\0';
    buf[0xe] = '\0';
    buf[0xf] = '\0';
    pcStack_200 = (code *)0x15452f;
    uVar23 = (uv_buf_t)uv_buf_init(buf,0x20);
    local_1f8 = 0;
    pcVar6 = (char *)0x0;
    pcStack_200 = (code *)0x154565;
    iov = uVar23;
    iVar3 = uv_fs_read(0,unaff_R14,puVar7,&iov,1,0xffffffffffffffff);
    if (iVar3 < 0) goto LAB_00154659;
    if ((long)local_170 < 0) goto LAB_0015465e;
    pcVar6 = buf;
    pcStack_200 = (code *)0x15458f;
    iVar3 = strcmp(buf,test_buf);
    if (iVar3 != 0) goto LAB_00154663;
    pcStack_200 = (code *)0x1545a4;
    uv_fs_req_cleanup(&stack0xfffffffffffffe38);
    pcStack_200 = (code *)0x1545b2;
    uv_fs_close(0,&stack0xfffffffffffffe38,uVar4,0);
    pcStack_200 = (code *)0x1545ba;
    uv_fs_req_cleanup(&stack0xfffffffffffffe38);
    pcStack_200 = (code *)0x1545cd;
    unlink(mkstemp_req1.path);
    unaff_R14 = &mkstemp_req2;
    pcStack_200 = (code *)0x1545e0;
    unlink(mkstemp_req2.path);
    pcStack_200 = (code *)0x1545e8;
    uv_fs_req_cleanup(&mkstemp_req1);
    pcStack_200 = (code *)0x1545f0;
    uv_fs_req_cleanup(&mkstemp_req2);
    pcStack_200 = (code *)0x1545f5;
    puVar7 = (uv_loop_t *)uv_default_loop();
    pcStack_200 = (code *)0x154609;
    uv_walk(puVar7,close_walk_cb,0);
    pcStack_200 = (code *)0x154613;
    uv_run(puVar7,0);
    pcStack_200 = (code *)0x154618;
    pcVar6 = (char *)uv_default_loop();
    pcStack_200 = (code *)0x154620;
    iVar3 = uv_loop_close();
    if (iVar3 == 0) {
      return 0;
    }
  }
  else {
    pcStack_200 = (code *)0x154636;
    run_test_fs_mkstemp_cold_1();
LAB_00154636:
    pcStack_200 = (code *)0x15463b;
    run_test_fs_mkstemp_cold_2();
LAB_0015463b:
    pcStack_200 = (code *)0x154640;
    run_test_fs_mkstemp_cold_3();
LAB_00154640:
    pcStack_200 = (code *)0x154645;
    run_test_fs_mkstemp_cold_12();
LAB_00154645:
    pcStack_200 = (code *)0x15464a;
    run_test_fs_mkstemp_cold_4();
LAB_0015464a:
    pcStack_200 = (code *)0x15464f;
    run_test_fs_mkstemp_cold_5();
LAB_0015464f:
    pcStack_200 = (code *)0x154654;
    run_test_fs_mkstemp_cold_6();
LAB_00154654:
    pcStack_200 = (code *)0x154659;
    run_test_fs_mkstemp_cold_7();
LAB_00154659:
    pcStack_200 = (code *)0x15465e;
    run_test_fs_mkstemp_cold_8();
LAB_0015465e:
    pcStack_200 = (code *)0x154663;
    run_test_fs_mkstemp_cold_9();
LAB_00154663:
    pcStack_200 = (code *)0x154668;
    run_test_fs_mkstemp_cold_10();
  }
  pcStack_200 = mkstemp_cb;
  run_test_fs_mkstemp_cold_11();
  if ((uv_fs_t *)pcVar6 == &mkstemp_req1) {
    puStack_208 = (uv_fs_t *)0x154686;
    pcStack_200._0_4_ = extraout_EAX;
    check_mkstemp_result(&mkstemp_req1);
    mkstemp_cb_count = mkstemp_cb_count + 1;
    return (int)pcStack_200;
  }
  puStack_208 = (uv_fs_t *)check_mkstemp_result;
  mkstemp_cb_cold_1();
  puStack_210 = puVar7;
  puStack_208 = unaff_R14;
  if (((uv_loop_t *)pcVar6)->backend_fd == UV_FS_MKSTEMP) {
    if ((long)((uv_loop_t *)pcVar6)->watcher_queue[0] < 0) goto LAB_0015474a;
    puVar17 = (uv_fs_t *)((uv_loop_t *)pcVar6)->watchers;
    if (puVar17 == (uv_fs_t *)0x0) goto LAB_0015474f;
    puStack_220 = (uv_fs_t *)0x1546c4;
    sVar8 = strlen((char *)puVar17);
    if (sVar8 != 0x10) goto LAB_00154754;
    if ((short)puVar17->type != 0x5f65 ||
        (uv__io_t *)puVar17->data != (uv__io_t *)0x6c69665f74736574) goto LAB_00154759;
    if (*(short *)&puVar17->field_0xe == 0x5858 && *(int *)((long)&puVar17->type + 2) == 0x58585858)
    goto LAB_0015475e;
    puStack_220 = (uv_fs_t *)0x154711;
    check_permission((char *)puVar17,0x180);
    puStack_220 = (uv_fs_t *)0x154725;
    iVar3 = uv_fs_stat(0,&stat_req,((uv_loop_t *)pcVar6)->watchers,0);
    if (iVar3 != 0) goto LAB_00154763;
    if ((stat_req.statbuf.st_mode._1_1_ & 0x80) != 0) {
      iVar3 = uv_fs_req_cleanup(&stat_req);
      return iVar3;
    }
  }
  else {
    puStack_220 = (uv_fs_t *)0x15474a;
    check_mkstemp_result_cold_1();
    pcVar6 = (char *)puVar7;
LAB_0015474a:
    puStack_220 = (uv_fs_t *)0x15474f;
    check_mkstemp_result_cold_2();
    puVar17 = unaff_R14;
LAB_0015474f:
    puStack_220 = (uv_fs_t *)0x154754;
    check_mkstemp_result_cold_8();
LAB_00154754:
    puStack_220 = (uv_fs_t *)0x154759;
    check_mkstemp_result_cold_3();
LAB_00154759:
    puStack_220 = (uv_fs_t *)0x15475e;
    check_mkstemp_result_cold_4();
LAB_0015475e:
    puStack_220 = (uv_fs_t *)0x154763;
    check_mkstemp_result_cold_7();
LAB_00154763:
    puStack_220 = (uv_fs_t *)0x154768;
    check_mkstemp_result_cold_5();
  }
  puStack_220 = (uv_fs_t *)run_test_fs_fstat;
  check_mkstemp_result_cold_6();
  pcVar13 = "test_file";
  pcStack_488 = (code *)0x154786;
  puStack_228 = (uv_loop_t *)pcVar6;
  puStack_220 = puVar17;
  unlink("test_file");
  pcStack_488 = (code *)0x15478b;
  loop = (uv_loop_t *)uv_default_loop();
  puVar7 = (uv_loop_t *)0x0;
  pcStack_488 = (code *)0x1547b2;
  iVar3 = uv_fs_open(0,&uStack_3e0,"test_file",0x42,0x180,0);
  sVar2 = uStack_3e0.result;
  if (iVar3 < 0) {
    pcStack_488 = (code *)0x154b17;
    run_test_fs_fstat_cold_1();
LAB_00154b17:
    pcStack_488 = (code *)0x154b1c;
    run_test_fs_fstat_cold_2();
LAB_00154b1c:
    pcStack_488 = (code *)0x154b21;
    run_test_fs_fstat_cold_3();
LAB_00154b21:
    pcStack_488 = (code *)0x154b26;
    run_test_fs_fstat_cold_4();
LAB_00154b26:
    pcStack_488 = (code *)0x154b2b;
    run_test_fs_fstat_cold_5();
LAB_00154b2b:
    pcStack_488 = (code *)0x154b30;
    run_test_fs_fstat_cold_6();
LAB_00154b30:
    pcStack_488 = (code *)0x154b35;
    run_test_fs_fstat_cold_7();
LAB_00154b35:
    pcStack_488 = (code *)0x154b3a;
    run_test_fs_fstat_cold_8();
LAB_00154b3a:
    pcStack_488 = (code *)0x154b3f;
    run_test_fs_fstat_cold_9();
LAB_00154b3f:
    pcStack_488 = (code *)0x154b44;
    run_test_fs_fstat_cold_10();
LAB_00154b44:
    pcStack_488 = (code *)0x154b49;
    run_test_fs_fstat_cold_11();
LAB_00154b49:
    pcStack_488 = (code *)0x154b4e;
    run_test_fs_fstat_cold_12();
LAB_00154b4e:
    pcStack_488 = (code *)0x154b53;
    run_test_fs_fstat_cold_13();
LAB_00154b53:
    pcStack_488 = (code *)0x154b58;
    run_test_fs_fstat_cold_14();
LAB_00154b58:
    pcStack_488 = (code *)0x154b5d;
    run_test_fs_fstat_cold_15();
LAB_00154b5d:
    pcStack_488 = (code *)0x154b62;
    run_test_fs_fstat_cold_16();
LAB_00154b62:
    pcStack_488 = (code *)0x154b67;
    run_test_fs_fstat_cold_17();
LAB_00154b67:
    pcStack_488 = (code *)0x154b6c;
    run_test_fs_fstat_cold_18();
LAB_00154b6c:
    pcStack_488 = (code *)0x154b71;
    run_test_fs_fstat_cold_19();
LAB_00154b71:
    pcStack_488 = (code *)0x154b76;
    run_test_fs_fstat_cold_20();
LAB_00154b76:
    pcStack_488 = (code *)0x154b7b;
    run_test_fs_fstat_cold_21();
LAB_00154b7b:
    pcStack_488 = (code *)0x154b80;
    run_test_fs_fstat_cold_22();
LAB_00154b80:
    pcStack_488 = (code *)0x154b85;
    run_test_fs_fstat_cold_23();
LAB_00154b85:
    pcStack_488 = (code *)0x154b8a;
    run_test_fs_fstat_cold_24();
LAB_00154b8a:
    pcStack_488 = (code *)0x154b8f;
    run_test_fs_fstat_cold_25();
LAB_00154b8f:
    pcStack_488 = (code *)0x154b94;
    run_test_fs_fstat_cold_26();
LAB_00154b94:
    pcStack_488 = (code *)0x154b99;
    run_test_fs_fstat_cold_27();
LAB_00154b99:
    pcStack_488 = (code *)0x154b9e;
    run_test_fs_fstat_cold_28();
LAB_00154b9e:
    pcStack_488 = (code *)0x154ba3;
    run_test_fs_fstat_cold_29();
LAB_00154ba3:
    pcStack_488 = (code *)0x154ba8;
    run_test_fs_fstat_cold_30();
LAB_00154ba8:
    pcStack_488 = (code *)0x154bad;
    run_test_fs_fstat_cold_31();
LAB_00154bad:
    pcStack_488 = (code *)0x154bb2;
    run_test_fs_fstat_cold_32();
LAB_00154bb2:
    pcStack_488 = (code *)0x154bb7;
    run_test_fs_fstat_cold_33();
LAB_00154bb7:
    pcStack_488 = (code *)0x154bbc;
    run_test_fs_fstat_cold_34();
LAB_00154bbc:
    pcStack_488 = (code *)0x154bc1;
    run_test_fs_fstat_cold_35();
  }
  else {
    pcVar13 = (char *)uStack_3e0.result;
    if (uStack_3e0.result < 0) goto LAB_00154b17;
    pcStack_488 = (code *)0x1547d8;
    uv_fs_req_cleanup(&uStack_3e0);
    puVar7 = (uv_loop_t *)(sVar2 & 0xffffffff);
    pcStack_488 = (code *)0x1547e4;
    iVar3 = fstat64((int)sVar2,&sStack_470);
    pcVar13 = (char *)sVar2;
    if (iVar3 != 0) goto LAB_00154b1c;
    puVar7 = (uv_loop_t *)0x0;
    pcStack_488 = (code *)0x1547ff;
    iVar3 = uv_fs_fstat(0,&uStack_3e0,sVar2 & 0xffffffff,0);
    if (iVar3 != 0) goto LAB_00154b21;
    if ((char *)uStack_3e0.result != (char *)0x0) goto LAB_00154b26;
    uVar1 = ((uv_stat_t *)((long)uStack_3e0.ptr + 0x70))->st_gid;
    if ((uVar1 != 0) && (uVar1 != sStack_470.st_ctim.tv_sec)) goto LAB_00154b2b;
    uVar1 = ((uv_stat_t *)((long)uStack_3e0.ptr + 0x70))->st_rdev;
    if ((uVar1 != 0) && (uVar1 != sStack_470.st_ctim.tv_nsec)) goto LAB_00154b30;
    pcStack_488 = (code *)0x154860;
    uVar23 = (uv_buf_t)uv_buf_init(test_buf,0xd);
    uStack_480 = 0;
    puVar7 = (uv_loop_t *)0x0;
    pcStack_488 = (code *)0x15489b;
    iov = uVar23;
    iVar3 = uv_fs_write(0,&uStack_3e0,sVar2 & 0xffffffff,&iov,1,0xffffffffffffffff);
    if (iVar3 != 0xd) goto LAB_00154b35;
    if ((char *)uStack_3e0.result != (char *)0xd) goto LAB_00154b3a;
    puVar17 = &uStack_3e0;
    pcStack_488 = (code *)0x1548c3;
    uv_fs_req_cleanup(puVar17);
    pcStack_488 = (code *)0x1548da;
    memset(&uStack_3e0.statbuf,0xaa,0xa0);
    puVar7 = (uv_loop_t *)0x0;
    pcStack_488 = (code *)0x1548e8;
    iVar3 = uv_fs_fstat(0,puVar17,sVar2 & 0xffffffff,0);
    if (iVar3 != 0) goto LAB_00154b3f;
    if ((char *)uStack_3e0.result != (char *)0x0) goto LAB_00154b44;
    puVar17 = (uv_fs_t *)uStack_3e0.ptr;
    if (((void **)((long)uStack_3e0.ptr + 0x10))[5] != (void *)0xd) goto LAB_00154b49;
    puVar7 = (uv_loop_t *)(sVar2 & 0xffffffff);
    pcStack_488 = (code *)0x15491e;
    iVar3 = fstat64((int)sVar2,&sStack_470);
    if (iVar3 != 0) goto LAB_00154b4e;
    if ((uv__io_t *)*(void **)uStack_3e0.ptr != (uv__io_t *)sStack_470.st_dev) goto LAB_00154b53;
    if (*(ulong *)((long)uStack_3e0.ptr + 8) != (ulong)sStack_470.st_mode) goto LAB_00154b58;
    if (*(void **)((long)uStack_3e0.ptr + 0x10) != (void *)sStack_470.st_nlink) goto LAB_00154b5d;
    if (((void **)((long)uStack_3e0.ptr + 0x10))[1] != (void *)(ulong)sStack_470.st_uid)
    goto LAB_00154b62;
    if (((void **)((long)uStack_3e0.ptr + 0x10))[2] != (void *)(ulong)sStack_470.st_gid)
    goto LAB_00154b67;
    if (((void **)((long)uStack_3e0.ptr + 0x10))[3] != (void *)sStack_470.st_rdev)
    goto LAB_00154b6c;
    if (((void **)((long)uStack_3e0.ptr + 0x10))[4] != (void *)sStack_470.st_ino) goto LAB_00154b71;
    if (((void **)((long)uStack_3e0.ptr + 0x10))[5] != (void *)sStack_470.st_size)
    goto LAB_00154b76;
    if (*(long *)((long)uStack_3e0.ptr + 0x40) != sStack_470.st_blksize) goto LAB_00154b7b;
    if (*(uv_loop_t **)((long)uStack_3e0.ptr + 0x48) != (uv_loop_t *)sStack_470.st_blocks)
    goto LAB_00154b80;
    if (*(void **)((long)uStack_3e0.ptr + 0x60) != (void *)sStack_470.st_atim.tv_sec)
    goto LAB_00154b85;
    if (*(char **)((long)uStack_3e0.ptr + 0x68) != (char *)sStack_470.st_atim.tv_nsec)
    goto LAB_00154b8a;
    if (((uv_stat_t *)((long)uStack_3e0.ptr + 0x70))->st_dev != sStack_470.st_mtim.tv_sec)
    goto LAB_00154b8f;
    if (((uv_stat_t *)((long)uStack_3e0.ptr + 0x70))->st_mode != sStack_470.st_mtim.tv_nsec)
    goto LAB_00154b94;
    if (((uv_stat_t *)((long)uStack_3e0.ptr + 0x70))->st_nlink != sStack_470.st_ctim.tv_sec)
    goto LAB_00154b99;
    if (((uv_stat_t *)((long)uStack_3e0.ptr + 0x70))->st_uid != sStack_470.st_ctim.tv_nsec)
    goto LAB_00154b9e;
    if (*(uv_fs_cb *)((long)uStack_3e0.ptr + 0x50) != (uv_fs_cb)0x0) goto LAB_00154ba3;
    if (*(ssize_t *)((long)uStack_3e0.ptr + 0x58) != 0) goto LAB_00154ba8;
    puVar17 = &uStack_3e0;
    pcStack_488 = (code *)0x154a41;
    uv_fs_req_cleanup(puVar17);
    pcStack_488 = (code *)0x154a59;
    puVar7 = loop;
    iVar3 = uv_fs_fstat(loop,puVar17,sVar2 & 0xffffffff,fstat_cb);
    if (iVar3 != 0) goto LAB_00154bad;
    pcStack_488 = (code *)0x154a6f;
    puVar7 = loop;
    uv_run(loop,0);
    if (fstat_cb_count != 1) goto LAB_00154bb2;
    puVar7 = (uv_loop_t *)0x0;
    pcStack_488 = (code *)0x154a8f;
    iVar3 = uv_fs_close(0,&uStack_3e0,sVar2 & 0xffffffff,0);
    if (iVar3 != 0) goto LAB_00154bb7;
    if ((char *)uStack_3e0.result != (char *)0x0) goto LAB_00154bbc;
    pcStack_488 = (code *)0x154ab3;
    uv_fs_req_cleanup(&uStack_3e0);
    pcStack_488 = (code *)0x154ac1;
    uv_run(loop,0);
    pcStack_488 = (code *)0x154acd;
    unlink("test_file");
    pcStack_488 = (code *)0x154ad2;
    pcVar13 = (char *)uv_default_loop();
    pcStack_488 = (code *)0x154ae6;
    uv_walk(pcVar13,close_walk_cb,0);
    pcStack_488 = (code *)0x154af0;
    uv_run(pcVar13,0);
    pcStack_488 = (code *)0x154af5;
    puVar7 = (uv_loop_t *)uv_default_loop();
    pcStack_488 = (code *)0x154afd;
    iVar3 = uv_loop_close();
    if (iVar3 == 0) {
      return 0;
    }
  }
  pcStack_488 = fstat_cb;
  run_test_fs_fstat_cold_36();
  if (puVar7->backend_fd == 8) {
    if (puVar7->watcher_queue[0] != (void *)0x0) goto LAB_00154bf1;
    if (*(long *)((long)puVar7->watcher_queue[1] + 0x38) == 0xd) {
      puStack_490 = (uv_fs_t *)0x154be4;
      pcStack_488._0_4_ = extraout_EAX_00;
      uv_fs_req_cleanup();
      fstat_cb_count = fstat_cb_count + 1;
      return (int)pcStack_488;
    }
  }
  else {
    puStack_490 = (uv_fs_t *)0x154bf1;
    fstat_cb_cold_1();
LAB_00154bf1:
    puStack_490 = (uv_fs_t *)0x154bf6;
    fstat_cb_cold_2();
  }
  puStack_490 = (uv_fs_t *)run_test_fs_access;
  fstat_cb_cold_3();
  puVar21 = &uStack_650;
  puVar9 = &uStack_650;
  puVar14 = (uv_fs_t *)0x184395;
  pcStack_498 = pcVar13;
  puStack_490 = puVar17;
  unlink("test_file");
  rmdir("test_dir");
  loop = (uv_loop_t *)uv_default_loop();
  puVar7 = (uv_loop_t *)0x0;
  iVar3 = uv_fs_access(0,&uStack_650,"test_file",0,0);
  if (iVar3 < 0) {
    if (-1 < uStack_650.result) goto LAB_00154e64;
    uv_fs_req_cleanup(&uStack_650);
    puVar7 = loop;
    iVar3 = uv_fs_access(loop,&uStack_650,"test_file",0,access_cb);
    puVar14 = &uStack_650;
    if (iVar3 != 0) goto LAB_00154e69;
    puVar7 = loop;
    uv_run(loop,0);
    puVar14 = &uStack_650;
    if (access_cb_count != 1) goto LAB_00154e6e;
    access_cb_count = 0;
    puVar7 = (uv_loop_t *)0x0;
    iVar3 = uv_fs_open(0,&uStack_650,"test_file",0x42,0x180,0);
    puVar15 = (uv_fs_t *)uStack_650.result;
    puVar14 = &uStack_650;
    if (iVar3 < 0) goto LAB_00154e73;
    if (uStack_650.result < 0) goto LAB_00154e78;
    uv_fs_req_cleanup();
    puVar7 = (uv_loop_t *)0x0;
    iVar3 = uv_fs_access(0,&uStack_650,"test_file",0,0);
    puVar17 = &uStack_650;
    if (iVar3 != 0) goto LAB_00154e7d;
    puVar17 = &uStack_650;
    if ((char *)uStack_650.result != (char *)0x0) goto LAB_00154e82;
    uv_fs_req_cleanup(&uStack_650);
    puVar7 = loop;
    iVar3 = uv_fs_access(loop,&uStack_650,"test_file",0,access_cb);
    if (iVar3 != 0) goto LAB_00154e87;
    puVar7 = loop;
    uv_run(loop,0);
    puVar21 = &uStack_650;
    if (access_cb_count != 1) goto LAB_00154e8c;
    access_cb_count = 0;
    puVar7 = (uv_loop_t *)0x0;
    iVar3 = uv_fs_close(0,&uStack_650,(ulong)puVar15 & 0xffffffff,0);
    puVar21 = &uStack_650;
    if (iVar3 != 0) goto LAB_00154e91;
    puVar21 = &uStack_650;
    if ((char *)uStack_650.result != (char *)0x0) goto LAB_00154e96;
    uv_fs_req_cleanup();
    puVar7 = (uv_loop_t *)0x0;
    iVar3 = uv_fs_mkdir(0,&uStack_650,"test_dir",0x1ff,0);
    puVar15 = &uStack_650;
    puVar21 = &uStack_650;
    if (iVar3 != 0) goto LAB_00154e9b;
    uv_fs_req_cleanup();
    puVar7 = (uv_loop_t *)0x0;
    iVar3 = uv_fs_access(0,&uStack_650,"test_dir",2,0);
    puVar21 = &uStack_650;
    if (iVar3 != 0) goto LAB_00154ea0;
    puVar9 = &uStack_650;
    puVar21 = &uStack_650;
    if ((char *)uStack_650.result != (char *)0x0) goto LAB_00154ea5;
    uv_fs_req_cleanup(&uStack_650);
    uv_run(loop,0);
    unlink("test_file");
    rmdir("test_dir");
    puVar9 = (uv_fs_t *)uv_default_loop();
    uv_walk(puVar9,close_walk_cb,0);
    uv_run(puVar9,0);
    puVar7 = (uv_loop_t *)uv_default_loop();
    iVar3 = uv_loop_close();
    puVar21 = &uStack_650;
    if (iVar3 == 0) {
      return 0;
    }
  }
  else {
    run_test_fs_access_cold_1();
LAB_00154e64:
    run_test_fs_access_cold_2();
LAB_00154e69:
    run_test_fs_access_cold_3();
LAB_00154e6e:
    run_test_fs_access_cold_4();
LAB_00154e73:
    puVar15 = puVar14;
    run_test_fs_access_cold_5();
LAB_00154e78:
    run_test_fs_access_cold_6();
LAB_00154e7d:
    run_test_fs_access_cold_7();
LAB_00154e82:
    puVar21 = puVar17;
    run_test_fs_access_cold_8();
LAB_00154e87:
    run_test_fs_access_cold_9();
LAB_00154e8c:
    run_test_fs_access_cold_10();
LAB_00154e91:
    run_test_fs_access_cold_11();
LAB_00154e96:
    run_test_fs_access_cold_12();
LAB_00154e9b:
    puVar9 = puVar15;
    run_test_fs_access_cold_13();
LAB_00154ea0:
    run_test_fs_access_cold_14();
LAB_00154ea5:
    run_test_fs_access_cold_15();
  }
  run_test_fs_access_cold_16();
  if (puVar7->backend_fd == 0xc) {
    access_cb_count = access_cb_count + 1;
    iVar3 = uv_fs_req_cleanup();
    return iVar3;
  }
  access_cb_cold_1();
  pcVar6 = "test_file";
  pcStack_838 = (code *)0x154ee1;
  pcStack_670 = (char *)puVar9;
  puStack_668 = puVar21;
  unlink("test_file");
  pcStack_838 = (code *)0x154ee6;
  loop = (uv_loop_t *)uv_default_loop();
  puVar17 = &uStack_828;
  puVar7 = (uv_loop_t *)0x0;
  pcStack_838 = (code *)0x154f0a;
  iVar3 = uv_fs_open(0,puVar17,"test_file",0x42,0x180,0);
  sVar2 = uStack_828.result;
  if (iVar3 < 0) {
    pcStack_838 = (code *)0x1551dd;
    run_test_fs_chmod_cold_1();
LAB_001551dd:
    pcStack_838 = (code *)0x1551e2;
    run_test_fs_chmod_cold_2();
LAB_001551e2:
    pcStack_838 = (code *)0x1551e7;
    run_test_fs_chmod_cold_3();
LAB_001551e7:
    pcStack_838 = (code *)0x1551ec;
    run_test_fs_chmod_cold_4();
LAB_001551ec:
    pcStack_838 = (code *)0x1551f1;
    run_test_fs_chmod_cold_5();
LAB_001551f1:
    pcStack_838 = (code *)0x1551f6;
    run_test_fs_chmod_cold_6();
LAB_001551f6:
    pcStack_838 = (code *)0x1551fb;
    run_test_fs_chmod_cold_7();
LAB_001551fb:
    pcStack_838 = (code *)0x155200;
    run_test_fs_chmod_cold_8();
LAB_00155200:
    pcStack_838 = (code *)0x155205;
    run_test_fs_chmod_cold_9();
LAB_00155205:
    pcStack_838 = (code *)0x15520a;
    run_test_fs_chmod_cold_10();
LAB_0015520a:
    pcStack_838 = (code *)0x15520f;
    run_test_fs_chmod_cold_11();
LAB_0015520f:
    pcStack_838 = (code *)0x155214;
    run_test_fs_chmod_cold_12();
LAB_00155214:
    pcStack_838 = (code *)0x155219;
    run_test_fs_chmod_cold_13();
LAB_00155219:
    pcStack_838 = (code *)0x15521e;
    run_test_fs_chmod_cold_14();
LAB_0015521e:
    pcStack_838 = (code *)0x155223;
    run_test_fs_chmod_cold_15();
LAB_00155223:
    pcStack_838 = (code *)0x155228;
    run_test_fs_chmod_cold_16();
  }
  else {
    pcVar6 = (char *)uStack_828.result;
    if (uStack_828.result < 0) goto LAB_001551dd;
    puVar21 = &uStack_828;
    pcStack_838 = (code *)0x154f2d;
    uv_fs_req_cleanup(puVar21);
    pcStack_838 = (code *)0x154f3e;
    uVar23 = (uv_buf_t)uv_buf_init(test_buf,0xd);
    uStack_830 = 0;
    puVar7 = (uv_loop_t *)0x0;
    pcStack_838 = (code *)0x154f74;
    puVar17 = puVar21;
    iov = uVar23;
    iVar3 = uv_fs_write(0,puVar21,sVar2 & 0xffffffff,&iov,1,0xffffffffffffffff);
    pcVar6 = (char *)sVar2;
    if (iVar3 != 0xd) goto LAB_001551e2;
    if ((char *)uStack_828.result != (char *)0xd) goto LAB_001551e7;
    puVar21 = &uStack_828;
    pcStack_838 = (code *)0x154f96;
    uv_fs_req_cleanup();
    puVar7 = (uv_loop_t *)0x0;
    pcStack_838 = (code *)0x154faf;
    puVar17 = puVar21;
    iVar3 = uv_fs_chmod(0,puVar21,"test_file",0x80,0);
    if (iVar3 != 0) goto LAB_001551ec;
    if ((char *)uStack_828.result != (char *)0x0) goto LAB_001551f1;
    puVar21 = &uStack_828;
    pcStack_838 = (code *)0x154fd0;
    uv_fs_req_cleanup(puVar21);
    pcStack_838 = (code *)0x154fe4;
    check_permission("test_file",0x80);
    puVar7 = (uv_loop_t *)0x0;
    pcStack_838 = (code *)0x154ff9;
    puVar17 = puVar21;
    iVar3 = uv_fs_chmod(0,puVar21,"test_file",0x100,0);
    if (iVar3 != 0) goto LAB_001551f6;
    if ((char *)uStack_828.result != (char *)0x0) goto LAB_001551fb;
    puVar21 = &uStack_828;
    pcStack_838 = (code *)0x15501a;
    uv_fs_req_cleanup(puVar21);
    pcStack_838 = (code *)0x15502b;
    check_permission("test_file",0x100);
    puVar7 = (uv_loop_t *)0x0;
    pcStack_838 = (code *)0x15503f;
    puVar17 = puVar21;
    iVar3 = uv_fs_fchmod(0,puVar21,sVar2 & 0xffffffff,0x180,0);
    if (iVar3 != 0) goto LAB_00155200;
    if ((char *)uStack_828.result != (char *)0x0) goto LAB_00155205;
    puVar21 = &uStack_828;
    pcStack_838 = (code *)0x155060;
    uv_fs_req_cleanup(puVar21);
    pcStack_838 = (code *)0x155074;
    check_permission("test_file",0x180);
    uStack_828.data = &run_test_fs_chmod::mode;
    pcStack_838 = (code *)0x15509c;
    puVar17 = puVar21;
    puVar7 = loop;
    iVar3 = uv_fs_chmod(loop,puVar21,"test_file",0x80,chmod_cb);
    if (iVar3 != 0) goto LAB_0015520a;
    puVar17 = (uv_fs_t *)0x0;
    pcStack_838 = (code *)0x1550b2;
    puVar7 = loop;
    uv_run();
    if (chmod_cb_count != 1) goto LAB_0015520f;
    chmod_cb_count = 0;
    puVar17 = &uStack_828;
    uStack_828.data = &run_test_fs_chmod::mode_1;
    pcStack_838 = (code *)0x1550f7;
    puVar7 = loop;
    iVar3 = uv_fs_chmod(loop,puVar17,"test_file",0x100,chmod_cb);
    if (iVar3 != 0) goto LAB_00155214;
    puVar17 = (uv_fs_t *)0x0;
    pcStack_838 = (code *)0x15510d;
    puVar7 = loop;
    uv_run();
    if (chmod_cb_count != 1) goto LAB_00155219;
    puVar17 = &uStack_828;
    uStack_828.data = &run_test_fs_chmod::mode_2;
    pcStack_838 = (code *)0x155143;
    puVar7 = loop;
    iVar3 = uv_fs_fchmod(loop,puVar17,sVar2 & 0xffffffff,0x180,fchmod_cb);
    if (iVar3 != 0) goto LAB_0015521e;
    puVar17 = (uv_fs_t *)0x0;
    pcStack_838 = (code *)0x155159;
    puVar7 = loop;
    uv_run();
    if (fchmod_cb_count != 1) goto LAB_00155223;
    pcStack_838 = (code *)0x15517b;
    uv_fs_close(loop,&uStack_828,sVar2 & 0xffffffff,0);
    pcStack_838 = (code *)0x155189;
    uv_run(loop,0);
    pcStack_838 = (code *)0x155195;
    unlink("test_file");
    pcStack_838 = (code *)0x15519a;
    pcVar6 = (char *)uv_default_loop();
    pcStack_838 = (code *)0x1551ae;
    uv_walk(pcVar6,close_walk_cb,0);
    puVar17 = (uv_fs_t *)0x0;
    pcStack_838 = (code *)0x1551b8;
    uv_run(pcVar6);
    pcStack_838 = (code *)0x1551bd;
    puVar7 = (uv_loop_t *)uv_default_loop();
    pcStack_838 = (code *)0x1551c5;
    iVar3 = uv_loop_close();
    if (iVar3 == 0) {
      return 0;
    }
  }
  pcStack_838 = check_permission;
  run_test_fs_chmod_cold_17();
  puVar16 = (undefined8 *)((ulong)puVar17 & 0xffffffff);
  puVar18 = (undefined8 *)0x0;
  pcStack_a00 = (code *)0x155248;
  pcStack_838 = (code *)pcVar6;
  iVar3 = uv_fs_stat(0,auStack_9f0,puVar7,0);
  if (iVar3 == 0) {
    if (lStack_998 != 0) goto LAB_0015527c;
    if ((uStack_978 & 0x1ff) == (uint)puVar17) {
      pcStack_a00 = (code *)0x15526e;
      iVar3 = uv_fs_req_cleanup(auStack_9f0);
      return iVar3;
    }
  }
  else {
    pcStack_a00 = (code *)0x15527c;
    check_permission_cold_1();
LAB_0015527c:
    pcStack_a00 = (code *)0x155281;
    check_permission_cold_2();
  }
  pcStack_a00 = chmod_cb;
  check_permission_cold_3();
  pcStack_a00 = (code *)puVar16;
  if (*(int *)(puVar18 + 8) == 0xd) {
    puVar16 = puVar18;
    if (puVar18[0xb] == 0) {
      chmod_cb_count = chmod_cb_count + 1;
      pcStack_a08 = (code *)0x1552a5;
      uv_fs_req_cleanup(puVar18);
      check_permission("test_file",*(uint *)*puVar18);
      return extraout_EAX_01;
    }
  }
  else {
    pcStack_a08 = (code *)0x1552bc;
    chmod_cb_cold_1();
  }
  pcStack_a08 = fchmod_cb;
  chmod_cb_cold_2();
  pcStack_a08 = (code *)puVar16;
  if (*(int *)(puVar18 + 8) == 0xe) {
    puStack_a18 = puVar18;
    if (puVar18[0xb] == 0) {
      fchmod_cb_count = fchmod_cb_count + 1;
      puStack_a10 = (uv_fs_t *)0x1552e0;
      uv_fs_req_cleanup(puVar18);
      check_permission("test_file",*(uint *)*puVar18);
      return extraout_EAX_02;
    }
  }
  else {
    puStack_a10 = (uv_fs_t *)0x1552f7;
    fchmod_cb_cold_1();
    puStack_a18 = puVar16;
  }
  puStack_a10 = (uv_fs_t *)run_test_fs_unlink_readonly;
  fchmod_cb_cold_2();
  puVar17 = (uv_fs_t *)0x184395;
  puStack_be8 = (uv_fs_t *)0x155315;
  puStack_a10 = puVar21;
  unlink("test_file");
  puStack_be8 = (uv_fs_t *)0x15531a;
  loop = (uv_loop_t *)uv_default_loop();
  puStack_be8 = (uv_fs_t *)0x15533e;
  iVar3 = uv_fs_open(0,&uStack_bd0,"test_file",0x42,0x180,0);
  sVar2 = uStack_bd0.result;
  if (iVar3 < 0) {
    puStack_be8 = (uv_fs_t *)0x1554db;
    run_test_fs_unlink_readonly_cold_1();
LAB_001554db:
    puStack_be8 = (uv_fs_t *)0x1554e0;
    run_test_fs_unlink_readonly_cold_2();
LAB_001554e0:
    puStack_be8 = (uv_fs_t *)0x1554e5;
    run_test_fs_unlink_readonly_cold_3();
LAB_001554e5:
    puStack_be8 = (uv_fs_t *)0x1554ea;
    run_test_fs_unlink_readonly_cold_4();
LAB_001554ea:
    puStack_be8 = (uv_fs_t *)0x1554ef;
    run_test_fs_unlink_readonly_cold_5();
LAB_001554ef:
    puStack_be8 = (uv_fs_t *)0x1554f4;
    run_test_fs_unlink_readonly_cold_6();
LAB_001554f4:
    puStack_be8 = (uv_fs_t *)0x1554f9;
    run_test_fs_unlink_readonly_cold_7();
LAB_001554f9:
    puStack_be8 = (uv_fs_t *)0x1554fe;
    run_test_fs_unlink_readonly_cold_8();
  }
  else {
    puVar17 = (uv_fs_t *)uStack_bd0.result;
    if (uStack_bd0.result < 0) goto LAB_001554db;
    puVar21 = &uStack_bd0;
    puStack_be8 = (uv_fs_t *)0x155361;
    uv_fs_req_cleanup(puVar21);
    puStack_be8 = (uv_fs_t *)0x155372;
    uVar23 = (uv_buf_t)uv_buf_init(test_buf,0xd);
    uStack_be0 = 0;
    puStack_be8 = (uv_fs_t *)0x1553a8;
    iov = uVar23;
    iVar3 = uv_fs_write(0,puVar21,sVar2 & 0xffffffff,&iov,1,0xffffffffffffffff);
    puVar17 = (uv_fs_t *)sVar2;
    if (iVar3 != 0xd) goto LAB_001554e0;
    if ((uv_fs_t *)uStack_bd0.result != (uv_fs_t *)0xd) goto LAB_001554e5;
    puVar21 = &uStack_bd0;
    puStack_be8 = (uv_fs_t *)0x1553ca;
    uv_fs_req_cleanup(puVar21);
    puStack_be8 = (uv_fs_t *)0x1553dd;
    uv_fs_close(loop,puVar21,sVar2 & 0xffffffff,0);
    puStack_be8 = (uv_fs_t *)0x1553f6;
    iVar3 = uv_fs_chmod(0,puVar21,"test_file",0x100,0);
    if (iVar3 != 0) goto LAB_001554ea;
    if ((uv_fs_t *)uStack_bd0.result != (uv_fs_t *)0x0) goto LAB_001554ef;
    puVar17 = &uStack_bd0;
    puStack_be8 = (uv_fs_t *)0x155417;
    uv_fs_req_cleanup(puVar17);
    puVar21 = (uv_fs_t *)0x184395;
    puStack_be8 = (uv_fs_t *)0x15542b;
    check_permission("test_file",0x100);
    puStack_be8 = (uv_fs_t *)0x15543a;
    iVar3 = uv_fs_unlink(0,puVar17,"test_file",0);
    if (iVar3 != 0) goto LAB_001554f4;
    if ((uv_fs_t *)uStack_bd0.result != (uv_fs_t *)0x0) goto LAB_001554f9;
    puStack_be8 = (uv_fs_t *)0x15545b;
    uv_fs_req_cleanup(&uStack_bd0);
    puStack_be8 = (uv_fs_t *)0x155469;
    uv_run(loop,0);
    puVar21 = (uv_fs_t *)0x184395;
    puStack_be8 = (uv_fs_t *)0x155485;
    uv_fs_chmod(0,&uStack_bd0,"test_file",0x180,0);
    puStack_be8 = (uv_fs_t *)0x15548d;
    uv_fs_req_cleanup(&uStack_bd0);
    puStack_be8 = (uv_fs_t *)0x155495;
    unlink("test_file");
    puStack_be8 = (uv_fs_t *)0x15549a;
    puVar17 = (uv_fs_t *)uv_default_loop();
    puStack_be8 = (uv_fs_t *)0x1554ae;
    uv_walk(puVar17,close_walk_cb,0);
    puStack_be8 = (uv_fs_t *)0x1554b8;
    uv_run(puVar17,0);
    puStack_be8 = (uv_fs_t *)0x1554bd;
    uVar10 = uv_default_loop();
    puStack_be8 = (uv_fs_t *)0x1554c5;
    iVar3 = uv_loop_close(uVar10);
    if (iVar3 == 0) {
      return 0;
    }
  }
  puStack_be8 = (uv_fs_t *)run_test_fs_chown;
  run_test_fs_unlink_readonly_cold_9();
  puVar22 = &uStack_da8;
  puVar15 = &uStack_da8;
  puVar14 = &uStack_da8;
  puVar9 = &uStack_da8;
  puVar7 = (uv_loop_t *)0x184395;
  pcStack_db0 = (code *)0x15551c;
  puStack_bf0 = puVar17;
  puStack_be8 = puVar21;
  unlink("test_file");
  pcStack_db0 = (code *)0x155528;
  unlink("test_file_link");
  pcStack_db0 = (code *)0x15552d;
  loop = (uv_loop_t *)uv_default_loop();
  puVar11 = (uv_loop_t *)0x0;
  pcStack_db0 = (code *)0x15554f;
  iVar3 = uv_fs_open(0,&uStack_da8,"test_file",0x42,0x180,0);
  sVar2 = uStack_da8.result;
  if (iVar3 < 0) {
    pcStack_db0 = (code *)0x155820;
    run_test_fs_chown_cold_1();
LAB_00155820:
    pcStack_db0 = (code *)0x155825;
    run_test_fs_chown_cold_2();
LAB_00155825:
    pcStack_db0 = (code *)0x15582a;
    run_test_fs_chown_cold_3();
LAB_0015582a:
    puVar22 = puVar21;
    pcStack_db0 = (code *)0x15582f;
    run_test_fs_chown_cold_4();
LAB_0015582f:
    pcStack_db0 = (code *)0x155834;
    run_test_fs_chown_cold_5();
LAB_00155834:
    puVar15 = puVar22;
    pcStack_db0 = (code *)0x155839;
    run_test_fs_chown_cold_6();
LAB_00155839:
    pcStack_db0 = (code *)0x15583e;
    run_test_fs_chown_cold_7();
LAB_0015583e:
    pcStack_db0 = (code *)0x155843;
    run_test_fs_chown_cold_8();
LAB_00155843:
    pcStack_db0 = (code *)0x155848;
    run_test_fs_chown_cold_9();
LAB_00155848:
    pcStack_db0 = (code *)0x15584d;
    run_test_fs_chown_cold_10();
LAB_0015584d:
    pcStack_db0 = (code *)0x155852;
    run_test_fs_chown_cold_11();
LAB_00155852:
    pcStack_db0 = (code *)0x155857;
    run_test_fs_chown_cold_12();
LAB_00155857:
    pcStack_db0 = (code *)0x15585c;
    run_test_fs_chown_cold_13();
LAB_0015585c:
    puVar14 = puVar15;
    pcStack_db0 = (code *)0x155861;
    run_test_fs_chown_cold_14();
LAB_00155861:
    pcStack_db0 = (code *)0x155866;
    run_test_fs_chown_cold_15();
LAB_00155866:
    puVar9 = puVar14;
    pcStack_db0 = (code *)0x15586b;
    run_test_fs_chown_cold_16();
LAB_0015586b:
    pcStack_db0 = (code *)0x155870;
    run_test_fs_chown_cold_17();
LAB_00155870:
    pcStack_db0 = (code *)0x155875;
    run_test_fs_chown_cold_18();
LAB_00155875:
    pcStack_db0 = (code *)0x15587a;
    run_test_fs_chown_cold_19();
LAB_0015587a:
    pcStack_db0 = (code *)0x15587f;
    run_test_fs_chown_cold_20();
  }
  else {
    puVar7 = (uv_loop_t *)uStack_da8.result;
    if (uStack_da8.result < 0) goto LAB_00155820;
    pcStack_db0 = (code *)0x155570;
    uv_fs_req_cleanup();
    puVar11 = (uv_loop_t *)0x0;
    pcStack_db0 = (code *)0x15558f;
    iVar3 = uv_fs_chown(0,&uStack_da8,"test_file",0xffffffff,0xffffffff,0);
    puVar7 = (uv_loop_t *)sVar2;
    puVar21 = &uStack_da8;
    if (iVar3 != 0) goto LAB_00155825;
    puVar21 = &uStack_da8;
    if ((uv_loop_t *)uStack_da8.result != (uv_loop_t *)0x0) goto LAB_0015582a;
    pcStack_db0 = (code *)0x1555ae;
    uv_fs_req_cleanup();
    puVar11 = (uv_loop_t *)0x0;
    pcStack_db0 = (code *)0x1555c8;
    iVar3 = uv_fs_fchown(0,&uStack_da8,sVar2 & 0xffffffff,0xffffffff,0xffffffff,0);
    if (iVar3 != 0) goto LAB_0015582f;
    puVar22 = &uStack_da8;
    if ((uv_loop_t *)uStack_da8.result != (uv_loop_t *)0x0) goto LAB_00155834;
    pcStack_db0 = (code *)0x1555e7;
    uv_fs_req_cleanup(&uStack_da8);
    pcStack_db0 = (code *)0x15560f;
    puVar11 = loop;
    iVar3 = uv_fs_chown(loop,&uStack_da8,"test_file",0xffffffff,0xffffffff,chown_cb);
    if (iVar3 != 0) goto LAB_00155839;
    pcStack_db0 = (code *)0x155625;
    puVar11 = loop;
    uv_run(loop,0);
    puVar15 = &uStack_da8;
    if (chown_cb_count != 1) goto LAB_0015583e;
    chown_cb_count = 0;
    pcStack_db0 = (code *)0x15565e;
    puVar11 = loop;
    iVar3 = uv_fs_chown(loop,&uStack_da8,"test_file",0,0,chown_root_cb);
    puVar15 = &uStack_da8;
    if (iVar3 != 0) goto LAB_00155843;
    pcStack_db0 = (code *)0x155674;
    puVar11 = loop;
    uv_run(loop,0);
    puVar15 = &uStack_da8;
    if (chown_cb_count != 1) goto LAB_00155848;
    pcStack_db0 = (code *)0x1556a4;
    puVar11 = loop;
    iVar3 = uv_fs_fchown(loop,&uStack_da8,sVar2 & 0xffffffff,0xffffffff,0xffffffff,fchown_cb);
    puVar15 = &uStack_da8;
    if (iVar3 != 0) goto LAB_0015584d;
    pcStack_db0 = (code *)0x1556ba;
    puVar11 = loop;
    uv_run(loop,0);
    puVar15 = &uStack_da8;
    if (fchown_cb_count != 1) goto LAB_00155852;
    puVar11 = (uv_loop_t *)0x0;
    pcStack_db0 = (code *)0x1556e2;
    iVar3 = uv_fs_link(0,&uStack_da8,"test_file","test_file_link",0);
    puVar15 = &uStack_da8;
    if (iVar3 != 0) goto LAB_00155857;
    puVar15 = &uStack_da8;
    if ((uv_loop_t *)uStack_da8.result != (uv_loop_t *)0x0) goto LAB_0015585c;
    pcStack_db0 = (code *)0x155701;
    uv_fs_req_cleanup();
    puVar11 = (uv_loop_t *)0x0;
    pcStack_db0 = (code *)0x155720;
    iVar3 = uv_fs_lchown(0,&uStack_da8,"test_file_link",0xffffffff,0xffffffff,0);
    if (iVar3 != 0) goto LAB_00155861;
    puVar14 = &uStack_da8;
    if ((uv_loop_t *)uStack_da8.result != (uv_loop_t *)0x0) goto LAB_00155866;
    pcStack_db0 = (code *)0x15573f;
    uv_fs_req_cleanup(&uStack_da8);
    pcStack_db0 = (code *)0x155767;
    puVar11 = loop;
    iVar3 = uv_fs_lchown(loop,&uStack_da8,"test_file_link",0xffffffff,0xffffffff,lchown_cb);
    if (iVar3 != 0) goto LAB_0015586b;
    pcStack_db0 = (code *)0x15577d;
    puVar11 = loop;
    uv_run(loop,0);
    puVar9 = &uStack_da8;
    if (lchown_cb_count != 1) goto LAB_00155870;
    puVar11 = (uv_loop_t *)0x0;
    pcStack_db0 = (code *)0x155798;
    iVar3 = uv_fs_close(0,&uStack_da8,sVar2 & 0xffffffff,0);
    puVar9 = &uStack_da8;
    if (iVar3 != 0) goto LAB_00155875;
    puVar9 = &uStack_da8;
    if ((uv_loop_t *)uStack_da8.result != (uv_loop_t *)0x0) goto LAB_0015587a;
    pcStack_db0 = (code *)0x1557b4;
    uv_fs_req_cleanup(&uStack_da8);
    pcStack_db0 = (code *)0x1557c2;
    uv_run(loop,0);
    pcStack_db0 = (code *)0x1557ce;
    unlink("test_file");
    pcStack_db0 = (code *)0x1557da;
    unlink("test_file_link");
    pcStack_db0 = (code *)0x1557df;
    puVar7 = (uv_loop_t *)uv_default_loop();
    pcStack_db0 = (code *)0x1557f3;
    uv_walk(puVar7,close_walk_cb,0);
    pcStack_db0 = (code *)0x1557fd;
    uv_run(puVar7,0);
    pcStack_db0 = (code *)0x155802;
    puVar11 = (uv_loop_t *)uv_default_loop();
    pcStack_db0 = (code *)0x15580a;
    iVar3 = uv_loop_close();
    puVar9 = &uStack_da8;
    if (iVar3 == 0) {
      return 0;
    }
  }
  pcStack_db0 = chown_cb;
  run_test_fs_chown_cold_21();
  if (puVar11->backend_fd == 0x1a) {
    if (puVar11->watcher_queue[0] == (void *)0x0) {
      chown_cb_count = chown_cb_count + 1;
      iVar3 = uv_fs_req_cleanup();
      return iVar3;
    }
  }
  else {
    puStack_db8 = (uv_loop_t *)0x1558a3;
    chown_cb_cold_1();
  }
  puStack_db8 = (uv_loop_t *)chown_root_cb;
  chown_cb_cold_2();
  puStack_db8 = puVar7;
  if (puVar11->backend_fd == 0x1a) {
    pcStack_dc0 = (code *)0x1558b7;
    puVar19 = puVar11;
    _Var5 = geteuid();
    pvVar12 = puVar11->watcher_queue[0];
    if (_Var5 != 0) {
      if (pvVar12 == (void *)0xffffffffffffffff) goto LAB_001558cf;
      pcStack_dc0 = (code *)0x1558ca;
      chown_root_cb_cold_2();
    }
    puVar7 = puVar11;
    if (pvVar12 == (void *)0x0) {
LAB_001558cf:
      chown_cb_count = chown_cb_count + 1;
      iVar3 = uv_fs_req_cleanup(puVar11);
      return iVar3;
    }
  }
  else {
    pcStack_dc0 = (code *)0x1558e3;
    chown_root_cb_cold_1();
    puVar19 = puVar11;
  }
  pcStack_dc0 = fchown_cb;
  chown_root_cb_cold_3();
  if (puVar19->backend_fd == 0x1b) {
    if (puVar19->watcher_queue[0] == (void *)0x0) {
      fchown_cb_count = fchown_cb_count + 1;
      iVar3 = uv_fs_req_cleanup();
      return iVar3;
    }
  }
  else {
    pcStack_dc8 = (code *)0x155907;
    fchown_cb_cold_1();
  }
  pcStack_dc8 = lchown_cb;
  fchown_cb_cold_2();
  if (puVar19->backend_fd == 0x1e) {
    if (puVar19->watcher_queue[0] == (void *)0x0) {
      lchown_cb_count = lchown_cb_count + 1;
      iVar3 = uv_fs_req_cleanup();
      return iVar3;
    }
  }
  else {
    puStack_dd0 = (uv_fs_t *)0x15592b;
    lchown_cb_cold_1();
  }
  puStack_dd0 = (uv_fs_t *)run_test_fs_link;
  lchown_cb_cold_2();
  pcVar13 = "test_file";
  pcStack_fa8 = (code *)0x155949;
  puStack_dd8 = puVar7;
  puStack_dd0 = puVar9;
  unlink("test_file");
  pcStack_fa8 = (code *)0x155955;
  unlink("test_file_link");
  pcStack_fa8 = (code *)0x155961;
  unlink("test_file_link2");
  pcStack_fa8 = (code *)0x155966;
  loop = (uv_loop_t *)uv_default_loop();
  pcVar20 = (char *)0x0;
  pcStack_fa8 = (code *)0x15598a;
  iVar3 = uv_fs_open(0,acStack_f90,"test_file",0x42,0x180,0);
  pcVar6 = pcStack_f38;
  if (iVar3 < 0) {
    pcStack_fa8 = (code *)0x155cc8;
    run_test_fs_link_cold_1();
LAB_00155cc8:
    pcStack_fa8 = (code *)0x155ccd;
    run_test_fs_link_cold_2();
LAB_00155ccd:
    pcStack_fa8 = (code *)0x155cd2;
    run_test_fs_link_cold_3();
LAB_00155cd2:
    pcStack_fa8 = (code *)0x155cd7;
    run_test_fs_link_cold_4();
LAB_00155cd7:
    pcStack_fa8 = (code *)0x155cdc;
    run_test_fs_link_cold_5();
LAB_00155cdc:
    pcStack_fa8 = (code *)0x155ce1;
    run_test_fs_link_cold_6();
LAB_00155ce1:
    pcVar6 = pcVar13;
    pcStack_fa8 = (code *)0x155ce6;
    run_test_fs_link_cold_7();
LAB_00155ce6:
    pcStack_fa8 = (code *)0x155ceb;
    run_test_fs_link_cold_8();
LAB_00155ceb:
    pcStack_fa8 = (code *)0x155cf0;
    run_test_fs_link_cold_9();
LAB_00155cf0:
    pcStack_fa8 = (code *)0x155cf5;
    run_test_fs_link_cold_10();
LAB_00155cf5:
    pcStack_fa8 = (code *)0x155cfa;
    run_test_fs_link_cold_11();
LAB_00155cfa:
    pcStack_fa8 = (code *)0x155cff;
    run_test_fs_link_cold_12();
LAB_00155cff:
    pcStack_fa8 = (code *)0x155d04;
    run_test_fs_link_cold_13();
LAB_00155d04:
    pcVar13 = pcVar6;
    pcStack_fa8 = (code *)0x155d09;
    run_test_fs_link_cold_14();
LAB_00155d09:
    pcStack_fa8 = (code *)0x155d0e;
    run_test_fs_link_cold_15();
LAB_00155d0e:
    pcStack_fa8 = (code *)0x155d13;
    run_test_fs_link_cold_16();
LAB_00155d13:
    pcStack_fa8 = (code *)0x155d18;
    run_test_fs_link_cold_17();
LAB_00155d18:
    pcStack_fa8 = (code *)0x155d1d;
    run_test_fs_link_cold_18();
  }
  else {
    pcVar13 = pcStack_f38;
    if ((long)pcStack_f38 < 0) goto LAB_00155cc8;
    pcStack_fa8 = (code *)0x1559ad;
    uv_fs_req_cleanup(acStack_f90);
    pcStack_fa8 = (code *)0x1559be;
    uVar23 = (uv_buf_t)uv_buf_init(test_buf,0xd);
    uStack_fa0 = 0;
    pcVar20 = (char *)0x0;
    pcStack_fa8 = (code *)0x1559f4;
    iov = uVar23;
    iVar3 = uv_fs_write(0,acStack_f90,(ulong)pcVar6 & 0xffffffff,&iov,1,0xffffffffffffffff);
    pcVar13 = pcVar6;
    if (iVar3 != 0xd) goto LAB_00155ccd;
    if (pcStack_f38 != (char *)0xd) goto LAB_00155cd2;
    pcStack_fa8 = (code *)0x155a16;
    uv_fs_req_cleanup(acStack_f90);
    pcStack_fa8 = (code *)0x155a29;
    uv_fs_close(loop,acStack_f90,(ulong)pcVar6 & 0xffffffff,0);
    pcVar20 = (char *)0x0;
    pcStack_fa8 = (code *)0x155a44;
    iVar3 = uv_fs_link(0,acStack_f90,"test_file","test_file_link",0);
    if (iVar3 != 0) goto LAB_00155cd7;
    if (pcStack_f38 != (char *)0x0) goto LAB_00155cdc;
    pcStack_fa8 = (code *)0x155a65;
    uv_fs_req_cleanup();
    pcVar20 = (char *)0x0;
    pcStack_fa8 = (code *)0x155a81;
    iVar3 = uv_fs_open(0,acStack_f90,"test_file_link",2,0,0);
    pcVar6 = pcStack_f38;
    pcVar13 = acStack_f90;
    if (iVar3 < 0) goto LAB_00155ce1;
    if ((long)pcStack_f38 < 0) goto LAB_00155ce6;
    pcStack_fa8 = (code *)0x155aa4;
    uv_fs_req_cleanup(acStack_f90);
    buf[0x10] = '\0';
    buf[0x11] = '\0';
    buf[0x12] = '\0';
    buf[0x13] = '\0';
    buf[0x14] = '\0';
    buf[0x15] = '\0';
    buf[0x16] = '\0';
    buf[0x17] = '\0';
    buf[0x18] = '\0';
    buf[0x19] = '\0';
    buf[0x1a] = '\0';
    buf[0x1b] = '\0';
    buf[0x1c] = '\0';
    buf[0x1d] = '\0';
    buf[0x1e] = '\0';
    buf[0x1f] = '\0';
    buf[0] = '\0';
    buf[1] = '\0';
    buf[2] = '\0';
    buf[3] = '\0';
    buf[4] = '\0';
    buf[5] = '\0';
    buf[6] = '\0';
    buf[7] = '\0';
    buf[8] = '\0';
    buf[9] = '\0';
    buf[10] = '\0';
    buf[0xb] = '\0';
    buf[0xc] = '\0';
    buf[0xd] = '\0';
    buf[0xe] = '\0';
    buf[0xf] = '\0';
    pcStack_fa8 = (code *)0x155ac6;
    uVar23 = (uv_buf_t)uv_buf_init(buf,0x20);
    uStack_fa0 = 0;
    pcVar20 = (char *)0x0;
    pcStack_fa8 = (code *)0x155af8;
    iov = uVar23;
    iVar3 = uv_fs_read(0,acStack_f90,(ulong)pcVar6 & 0xffffffff,&iov,1,0);
    if (iVar3 < 0) goto LAB_00155ceb;
    if ((long)pcStack_f38 < 0) goto LAB_00155cf0;
    pcVar20 = buf;
    pcStack_fa8 = (code *)0x155b1f;
    iVar3 = strcmp(buf,test_buf);
    if (iVar3 != 0) goto LAB_00155cf5;
    pcStack_fa8 = (code *)0x155b2e;
    close((int)pcVar6);
    pcStack_fa8 = (code *)0x155b54;
    pcVar20 = (char *)loop;
    iVar3 = uv_fs_link(loop,acStack_f90,"test_file","test_file_link2",link_cb);
    if (iVar3 != 0) goto LAB_00155cfa;
    pcStack_fa8 = (code *)0x155b6a;
    pcVar20 = (char *)loop;
    uv_run(loop,0);
    if (link_cb_count != 1) goto LAB_00155cff;
    pcVar20 = (char *)0x0;
    pcStack_fa8 = (code *)0x155b95;
    iVar3 = uv_fs_open(0,acStack_f90,"test_file_link2",2,0,0);
    pcVar13 = pcStack_f38;
    if (iVar3 < 0) goto LAB_00155d04;
    if ((long)pcStack_f38 < 0) goto LAB_00155d09;
    pcStack_fa8 = (code *)0x155bb8;
    uv_fs_req_cleanup(acStack_f90);
    buf[0x10] = '\0';
    buf[0x11] = '\0';
    buf[0x12] = '\0';
    buf[0x13] = '\0';
    buf[0x14] = '\0';
    buf[0x15] = '\0';
    buf[0x16] = '\0';
    buf[0x17] = '\0';
    buf[0x18] = '\0';
    buf[0x19] = '\0';
    buf[0x1a] = '\0';
    buf[0x1b] = '\0';
    buf[0x1c] = '\0';
    buf[0x1d] = '\0';
    buf[0x1e] = '\0';
    buf[0x1f] = '\0';
    buf[0] = '\0';
    buf[1] = '\0';
    buf[2] = '\0';
    buf[3] = '\0';
    buf[4] = '\0';
    buf[5] = '\0';
    buf[6] = '\0';
    buf[7] = '\0';
    buf[8] = '\0';
    buf[9] = '\0';
    buf[10] = '\0';
    buf[0xb] = '\0';
    buf[0xc] = '\0';
    buf[0xd] = '\0';
    buf[0xe] = '\0';
    buf[0xf] = '\0';
    pcStack_fa8 = (code *)0x155bda;
    uVar23 = (uv_buf_t)uv_buf_init(buf,0x20);
    uStack_fa0 = 0;
    pcVar20 = (char *)0x0;
    pcStack_fa8 = (code *)0x155c0c;
    iov = uVar23;
    iVar3 = uv_fs_read(0,acStack_f90,(ulong)pcVar13 & 0xffffffff,&iov,1,0);
    if (iVar3 < 0) goto LAB_00155d0e;
    if ((long)pcStack_f38 < 0) goto LAB_00155d13;
    pcVar20 = buf;
    pcStack_fa8 = (code *)0x155c33;
    iVar3 = strcmp(buf,test_buf);
    if (iVar3 != 0) goto LAB_00155d18;
    pcStack_fa8 = (code *)0x155c50;
    uv_fs_close(loop,acStack_f90,(ulong)pcVar13 & 0xffffffff,0);
    pcStack_fa8 = (code *)0x155c5e;
    uv_run(loop,0);
    pcStack_fa8 = (code *)0x155c6a;
    unlink("test_file");
    pcStack_fa8 = (code *)0x155c76;
    unlink("test_file_link");
    pcStack_fa8 = (code *)0x155c82;
    unlink("test_file_link2");
    pcStack_fa8 = (code *)0x155c87;
    pcVar13 = (char *)uv_default_loop();
    pcStack_fa8 = (code *)0x155c9b;
    uv_walk(pcVar13,close_walk_cb,0);
    pcStack_fa8 = (code *)0x155ca5;
    uv_run(pcVar13,0);
    pcStack_fa8 = (code *)0x155caa;
    pcVar20 = (char *)uv_default_loop();
    pcStack_fa8 = (code *)0x155cb2;
    iVar3 = uv_loop_close();
    if (iVar3 == 0) {
      return 0;
    }
  }
  pcStack_fa8 = link_cb;
  run_test_fs_link_cold_19();
  if (((uv_loop_t *)pcVar20)->backend_fd == 0x17) {
    if (((uv_loop_t *)pcVar20)->watcher_queue[0] == (void *)0x0) {
      link_cb_count = link_cb_count + 1;
      iVar3 = uv_fs_req_cleanup();
      return iVar3;
    }
  }
  else {
    pcStack_fb0 = (code *)0x155d41;
    link_cb_cold_1();
  }
  pcStack_fb0 = run_test_fs_readlink;
  link_cb_cold_2();
  pcStack_fb0 = (code *)pcVar13;
  loop = (uv_loop_t *)uv_default_loop();
  iVar3 = uv_fs_readlink(loop,auStack_1168,"no_such_file",dummy_cb);
  if (iVar3 == 0) {
    iVar3 = uv_run(loop,0);
    if (iVar3 != 0) goto LAB_00155e3b;
    if (dummy_cb_count != 1) goto LAB_00155e40;
    if (lStack_1108 != 0) goto LAB_00155e45;
    if (lStack_1110 != -2) goto LAB_00155e4a;
    uv_fs_req_cleanup(auStack_1168);
    iVar3 = uv_fs_readlink(0,auStack_1168,"no_such_file",0);
    if (iVar3 != -2) goto LAB_00155e4f;
    if (lStack_1108 != 0) goto LAB_00155e54;
    if (lStack_1110 == -2) {
      uv_fs_req_cleanup(auStack_1168);
      uVar10 = uv_default_loop();
      uv_walk(uVar10,close_walk_cb,0);
      uv_run(uVar10,0);
      uVar10 = uv_default_loop();
      iVar3 = uv_loop_close(uVar10);
      if (iVar3 == 0) {
        return 0;
      }
      goto LAB_00155e5e;
    }
  }
  else {
    run_test_fs_readlink_cold_1();
LAB_00155e3b:
    run_test_fs_readlink_cold_2();
LAB_00155e40:
    run_test_fs_readlink_cold_3();
LAB_00155e45:
    run_test_fs_readlink_cold_4();
LAB_00155e4a:
    run_test_fs_readlink_cold_5();
LAB_00155e4f:
    run_test_fs_readlink_cold_6();
LAB_00155e54:
    run_test_fs_readlink_cold_7();
  }
  run_test_fs_readlink_cold_8();
LAB_00155e5e:
  run_test_fs_readlink_cold_9();
  dummy_cb_count = dummy_cb_count + 1;
  return extraout_EAX_03;
}

Assistant:

TEST_IMPL(fs_mkstemp) {
  int r;
  int fd;
  const char path_template[] = "test_file_XXXXXX";
  uv_fs_t req;

  loop = uv_default_loop();

  r = uv_fs_mkstemp(loop, &mkstemp_req1, path_template, mkstemp_cb);
  ASSERT(r == 0);

  uv_run(loop, UV_RUN_DEFAULT);
  ASSERT(mkstemp_cb_count == 1);

  /* sync mkstemp */
  r = uv_fs_mkstemp(NULL, &mkstemp_req2, path_template, NULL);
  ASSERT(r >= 0);
  check_mkstemp_result(&mkstemp_req2);

  /* mkstemp return different values on subsequent calls */
  ASSERT(strcmp(mkstemp_req1.path, mkstemp_req2.path) != 0);

  /* invalid template returns EINVAL */
  ASSERT(uv_fs_mkstemp(NULL, &mkstemp_req3, "test_file", NULL) == UV_EINVAL);

  /* We can write to the opened file */
  iov = uv_buf_init(test_buf, sizeof(test_buf));
  r = uv_fs_write(NULL, &req, mkstemp_req1.result, &iov, 1, -1, NULL);
  ASSERT(r == sizeof(test_buf));
  ASSERT(req.result == sizeof(test_buf));
  uv_fs_req_cleanup(&req);

  /* Cleanup */
  uv_fs_close(NULL, &req, mkstemp_req1.result, NULL);
  uv_fs_req_cleanup(&req);
  uv_fs_close(NULL, &req, mkstemp_req2.result, NULL);
  uv_fs_req_cleanup(&req);

  fd = uv_fs_open(NULL, &req, mkstemp_req1.path , O_RDONLY, 0, NULL);
  ASSERT(fd >= 0);
  uv_fs_req_cleanup(&req);

  memset(buf, 0, sizeof(buf));
  iov = uv_buf_init(buf, sizeof(buf));
  r = uv_fs_read(NULL, &req, fd, &iov, 1, -1, NULL);
  ASSERT(r >= 0);
  ASSERT(req.result >= 0);
  ASSERT(strcmp(buf, test_buf) == 0);
  uv_fs_req_cleanup(&req);

  uv_fs_close(NULL, &req, fd, NULL);
  uv_fs_req_cleanup(&req);

  unlink(mkstemp_req1.path);
  unlink(mkstemp_req2.path);
  uv_fs_req_cleanup(&mkstemp_req1);
  uv_fs_req_cleanup(&mkstemp_req2);

  MAKE_VALGRIND_HAPPY();
  return 0;
}